

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::CreateFortranModuleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *working_dir)

{
  cmMakefile *this_00;
  bool bVar1;
  cmValue cVar2;
  string *psVar3;
  string target_mod_dir;
  string local_c0;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Fortran_MODULE_DIRECTORY",(allocator<char> *)&local_70);
  cVar2 = GetProperty(this,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (cVar2.Value == (string *)0x0) {
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
    bVar1 = std::operator!=(psVar3,working_dir);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&local_c0);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_c0);
  }
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"CMAKE_Fortran_MODDIR_FLAG",(allocator<char> *)&local_70);
  cVar2 = cmMakefile::GetDefinition(this_00,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if ((local_c0._M_string_length != 0) && (cVar2.Value != (string *)0x0)) {
    bVar1 = cmsys::SystemTools::FileIsFullPath(&local_c0);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
    else {
      psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
      local_a0.View_._M_str = (psVar3->_M_dataplus)._M_p;
      local_a0.View_._M_len = psVar3->_M_string_length;
      local_70.View_._M_str = local_70.Digits_;
      local_70.View_._M_len = 1;
      local_70.Digits_[0] = '/';
      cmStrCat<std::__cxx11::string>(&local_40,&local_a0,&local_70,&local_c0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::CreateFortranModuleDirectory(
  std::string const& working_dir) const
{
  std::string mod_dir;
  std::string target_mod_dir;
  if (cmValue prop = this->GetProperty("Fortran_MODULE_DIRECTORY")) {
    target_mod_dir = *prop;
  } else {
    std::string const& default_mod_dir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    if (default_mod_dir != working_dir) {
      target_mod_dir = default_mod_dir;
    }
  }
  cmValue moddir_flag =
    this->Makefile->GetDefinition("CMAKE_Fortran_MODDIR_FLAG");
  if (!target_mod_dir.empty() && moddir_flag) {
    // Compute the full path to the module directory.
    if (cmSystemTools::FileIsFullPath(target_mod_dir)) {
      // Already a full path.
      mod_dir = target_mod_dir;
    } else {
      // Interpret relative to the current output directory.
      mod_dir = cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(),
                         '/', target_mod_dir);
    }

    // Make sure the module output directory exists.
    cmSystemTools::MakeDirectory(mod_dir);
  }
  return mod_dir;
}